

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.h
# Opt level: O2

Numeral * __thiscall
viras::
Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
::add(Numeral *__return_storage_ptr__,
     Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
     *this,Numeral *l,Numeral *r)

{
  RationalConstantType local_50;
  RationalConstantType local_30;
  
  Kernel::RationalConstantType::RationalConstantType(&local_30,l);
  Kernel::RationalConstantType::RationalConstantType(&local_50,r);
  Kernel::RationalConstantType::operator+(__return_storage_ptr__,&local_30,&local_50);
  Kernel::RationalConstantType::~RationalConstantType(&local_50);
  Kernel::RationalConstantType::~RationalConstantType(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Numeral add(Numeral l, Numeral r) { return api.add(l,r); }